

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O0

bool __thiscall cppcms::anon_unknown_0::option::matches(option *this,string *path,char *method)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_RDI;
  char *unaff_retaddr;
  int in_stack_00000034;
  regex *in_stack_00000038;
  cmatch *in_stack_00000040;
  char *in_stack_00000048;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (*(int *)(in_RDI + 0x38) == 1) {
    if ((in_RDX == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
       (bVar1 = std::operator!=(in_RDX,in_RDI), bVar1)) {
      return false;
    }
  }
  else if ((*(int *)(in_RDI + 0x38) == 2) &&
          ((in_RDX == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 ||
           (bVar1 = booster::regex_match<booster::regex>
                              (unaff_retaddr,
                               (regex *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8
                                                ),(int)((ulong)in_RDI >> 0x20)), !bVar1)))) {
    return false;
  }
  std::__cxx11::string::c_str();
  bVar1 = booster::regex_match<booster::regex>
                    (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000034);
  return bVar1;
}

Assistant:

bool matches(std::string const &path,char const *method)
			{
				if(match_method_==1) {
					if(!method || method_ != method)
						return false;
				}
				else if(match_method_ == 2) {
					if(!method || !booster::regex_match(method,mexpr_))
						return false;
				}
				
				return booster::regex_match(path.c_str(),match_,expr_);
			}